

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plt-elf.c
# Opt level: O0

void * lib_dt_lookup(plt_lib lib,ElfSWord tag)

{
  Elf64_Dyn *local_30;
  Elf64_Dyn *dyn;
  Elf64_Addr base;
  ElfSWord tag_local;
  plt_lib lib_local;
  
  local_30 = lib->l_ld;
  while( true ) {
    if (local_30->d_tag == 0) {
      return (void *)0x0;
    }
    if (local_30->d_tag == tag) break;
    local_30 = local_30 + 1;
  }
  if ((lib->l_addr <= (local_30->d_un).d_val) && ((local_30->d_un).d_val >> 0x38 != 0xff)) {
    return (void *)(local_30->d_un).d_val;
  }
  return (void *)(lib->l_addr + (local_30->d_un).d_val);
}

Assistant:

static void *lib_dt_lookup(plt_lib lib, ElfSWord tag)
{
    ElfW(Addr) base =(ElfW(Addr)) lib->l_addr;
    for (const ElfW(Dyn) *dyn = lib->l_ld; dyn->d_tag != DT_NULL; ++dyn) {
        if (dyn->d_tag == tag) {
            if (dyn->d_un.d_ptr >= base
                    && (dyn->d_un.d_ptr >> (MMK_BITS - 8)) ^ 0xff)
                return (void*) dyn->d_un.d_ptr;
            else
                return (char*) base + dyn->d_un.d_ptr;
        }
    }
    return NULL;
}